

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::callback
          (FilterCase *this,GLenum source,GLenum type,GLuint id,GLenum severity,string *message)

{
  pointer *ppMVar1;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  *pvVar2;
  pointer this_00;
  ulong uVar3;
  ulong uVar4;
  pointer __result;
  pointer pMVar5;
  pointer pMVar6;
  long lVar7;
  _Tp_alloc_type *__alloc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  _Tp_alloc_type *local_58;
  size_type local_50;
  _Tp_alloc_type local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  pointer local_38;
  
  pvVar2 = this->m_currentErrors;
  if (pvVar2 != (vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                 *)0x0) {
    std::__cxx11::string::string((string *)&local_58,(string *)message);
    pMVar6 = (pvVar2->
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar6 == (pvVar2->
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_38 = (pvVar2->
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if ((long)pMVar6 - (long)local_38 == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar3 = ((long)pMVar6 - (long)local_38) / 0x30;
      uVar4 = 1;
      if (pMVar6 != local_38) {
        uVar4 = uVar3;
      }
      uVar9 = uVar4 + uVar3;
      if (0x2aaaaaaaaaaaaa9 < uVar9) {
        uVar9 = 0x2aaaaaaaaaaaaaa;
      }
      if (CARRY8(uVar4,uVar3)) {
        uVar9 = 0x2aaaaaaaaaaaaaa;
      }
      if (uVar9 == 0) {
        __result = (pointer)0x0;
      }
      else {
        __result = (pointer)operator_new(uVar9 * 0x30);
      }
      this_00 = local_38;
      __alloc = &local_48;
      pMVar5 = __result + uVar3;
      paVar8 = &(pMVar5->message).field_2;
      (pMVar5->id).source = source;
      (pMVar5->id).type = type;
      *(ulong *)&(pMVar5->id).id = CONCAT44(severity,id);
      (pMVar5->message)._M_dataplus._M_p = (pointer)paVar8;
      if (local_58 == __alloc) {
        paVar8->_M_allocated_capacity = CONCAT71(uStack_47,local_48);
        *(undefined8 *)((long)&(pMVar5->message).field_2 + 8) = uStack_40;
      }
      else {
        __result[uVar3].message._M_dataplus._M_p = (pointer)local_58;
        __result[uVar3].message.field_2._M_allocated_capacity = CONCAT71(uStack_47,local_48);
      }
      __result[uVar3].message._M_string_length = local_50;
      local_50 = 0;
      local_48 = (_Tp_alloc_type)0x0;
      local_58 = __alloc;
      pMVar5 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
               ::_S_relocate(local_38,pMVar6,__result,__alloc);
      pMVar6 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
               ::_S_relocate(pMVar6,pMVar6,pMVar5 + 1,__alloc);
      lVar7 = (long)(pvVar2->
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
      std::
      _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                       *)this_00,(pointer)(lVar7 / 0x30),lVar7 % 0x30);
      (pvVar2->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      )._M_impl.super__Vector_impl_data._M_start = __result;
      (pvVar2->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      )._M_impl.super__Vector_impl_data._M_finish = pMVar6;
      (pvVar2->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar9;
    }
    else {
      (pMVar6->id).source = source;
      (pMVar6->id).type = type;
      *(ulong *)&(pMVar6->id).id = CONCAT44(severity,id);
      paVar8 = &(pMVar6->message).field_2;
      (pMVar6->message)._M_dataplus._M_p = (pointer)paVar8;
      if (local_58 == &local_48) {
        paVar8->_M_allocated_capacity = CONCAT71(uStack_47,local_48);
        *(undefined8 *)((long)&(pMVar6->message).field_2 + 8) = uStack_40;
      }
      else {
        (pMVar6->message)._M_dataplus._M_p = (pointer)local_58;
        (pMVar6->message).field_2._M_allocated_capacity = CONCAT71(uStack_47,local_48);
      }
      (pMVar6->message)._M_string_length = local_50;
      local_50 = 0;
      local_48 = (_Tp_alloc_type)0x0;
      ppMVar1 = &(pvVar2->
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
      local_58 = &local_48;
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void FilterCase::callback (GLenum source, GLenum type, GLuint id, GLenum severity, const string& message)
{
	if (m_currentErrors)
		m_currentErrors->push_back(MessageData(MessageID(source, type, id), severity, message));
}